

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

int osfmode(char *fname,int follow_links,unsigned_long *mode,unsigned_long *attr)

{
  int iVar1;
  os_file_stat_t s;
  os_file_stat_t local_40;
  
  iVar1 = os_file_stat(fname,follow_links,&local_40);
  if (iVar1 != 0) {
    if (mode != (unsigned_long *)0x0) {
      *mode = local_40.mode;
    }
    if (attr != (unsigned_long *)0x0) {
      *attr = local_40.attrs;
    }
  }
  return iVar1;
}

Assistant:

int
osfmode( const char *fname, int follow_links, unsigned long *mode,
         unsigned long* attr )
{
    os_file_stat_t s;
    int ok;
    if ((ok = os_file_stat(fname, follow_links, &s)) != false) {
        if (mode != NULL)
            *mode = s.mode;
        if (attr != NULL)
            *attr = s.attrs;
    }
    return ok;
}